

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::paintEvent(QMdiArea *this,QPaintEvent *paintEvent)

{
  QWidget *pQVar1;
  QMdiAreaPrivate *pQVar2;
  QBrush *pQVar3;
  QPaintEvent *in_RSI;
  long in_FS_OFFSET;
  QRect *exposedRect;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  QMdiAreaPrivate *d;
  QPainter painter;
  QPaintDevice *local_50;
  QBrush *local_38;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMdiArea *)0x6159da);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (pQVar2->super_QAbstractScrollAreaPrivate).viewport;
  local_50 = (QPaintDevice *)0x0;
  if (pQVar1 != (QWidget *)0x0) {
    local_50 = &pQVar1->super_QPaintDevice;
  }
  QPainter::QPainter((QPainter *)&local_10,local_50);
  QPaintEvent::region(in_RSI);
  local_38 = (QBrush *)QRegion::begin();
  pQVar3 = (QBrush *)QRegion::end();
  for (; local_38 != pQVar3; local_38 = local_38 + 0x10) {
    QPainter::fillRect((QRect *)&local_10,local_38);
  }
  QPainter::~QPainter((QPainter *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::paintEvent(QPaintEvent *paintEvent)
{
    Q_D(QMdiArea);
    QPainter painter(d->viewport);
    for (const QRect &exposedRect : paintEvent->region())
        painter.fillRect(exposedRect, d->background);
}